

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_free(lys_module *module,_func_void_lys_node_ptr_void_ptr *private_destructor,
             int remove_from_ctx)

{
  ly_ctx *ctx_00;
  int local_2c;
  int i;
  ly_ctx *ctx;
  int remove_from_ctx_local;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_module *module_local;
  
  if (module != (lys_module *)0x0) {
    ctx_00 = module->ctx;
    if ((remove_from_ctx != 0) && ((ctx_00->models).used != 0)) {
      for (local_2c = 0; local_2c < (ctx_00->models).used; local_2c = local_2c + 1) {
        if ((ctx_00->models).list[local_2c] == module) {
          (ctx_00->models).used = (ctx_00->models).used + -1;
          memmove((ctx_00->models).list + local_2c,(ctx_00->models).list[local_2c + 1],
                  (long)((ctx_00->models).used - local_2c) << 3);
          (ctx_00->models).list[(ctx_00->models).used] = (lys_module *)0x0;
          break;
        }
      }
    }
    module_free_common(module,private_destructor);
    lydict_remove(ctx_00,module->ns);
    free(module);
  }
  return;
}

Assistant:

void
lys_free(struct lys_module *module, void (*private_destructor)(const struct lys_node *node, void *priv), int remove_from_ctx)
{
    struct ly_ctx *ctx;
    int i;

    if (!module) {
        return;
    }

    /* remove schema from the context */
    ctx = module->ctx;
    if (remove_from_ctx && ctx->models.used) {
        for (i = 0; i < ctx->models.used; i++) {
            if (ctx->models.list[i] == module) {
                /* move all the models to not change the order in the list */
                ctx->models.used--;
                memmove(&ctx->models.list[i], ctx->models.list[i + 1], (ctx->models.used - i) * sizeof *ctx->models.list);
                ctx->models.list[ctx->models.used] = NULL;
                /* we are done */
                break;
            }
        }
    }

    /* common part with struct ly_submodule */
    module_free_common(module, private_destructor);

    /* specific items to free */
    lydict_remove(ctx, module->ns);

    free(module);
}